

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

bool __thiscall glslang::TType::coopVecParameterOK(TType *this,TType *right)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if ((this->field_0xb & 8) == 0) {
    return false;
  }
  if ((right->field_0xb & 8) == 0) {
LAB_0043e6b8:
    bVar3 = false;
  }
  else {
    iVar1 = (*this->_vptr_TType[7])();
    iVar2 = (*right->_vptr_TType[7])(right);
    if ((iVar1 == iVar2) || (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 0x19)) {
      if (this->typeParameters != (TTypeParameters *)0x0) goto LAB_0043e6b8;
    }
    else {
      iVar1 = (*right->_vptr_TType[7])(right);
      if (iVar1 != 0x19) {
        return false;
      }
      if (this->typeParameters != (TTypeParameters *)0x0) {
        return false;
      }
    }
    bVar3 = right->typeParameters != (TTypeParameters *)0x0;
  }
  return bVar3;
}

Assistant:

bool isCoopVecNV() const { return coopvecNV; }